

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result wabt::interp::ReadBinaryInterp
                 (void *data,size_t size,ReadBinaryOptions *options,Errors *errors,
                 ModuleDesc *out_module)

{
  Result RVar1;
  undefined1 local_3c8 [8];
  BinaryReaderInterp reader;
  ModuleDesc *out_module_local;
  Errors *errors_local;
  ReadBinaryOptions *options_local;
  size_t size_local;
  void *data_local;
  
  reader.event_types_.
  super__Vector_base<wabt::interp::EventType,_std::allocator<wabt::interp::EventType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)out_module;
  anon_unknown_0::BinaryReaderInterp::BinaryReaderInterp
            ((BinaryReaderInterp *)local_3c8,out_module,errors,&options->features);
  RVar1 = ReadBinary(data,size,(BinaryReaderDelegate *)local_3c8,options);
  anon_unknown_0::BinaryReaderInterp::~BinaryReaderInterp((BinaryReaderInterp *)local_3c8);
  return (Result)RVar1.enum_;
}

Assistant:

Result ReadBinaryInterp(const void* data,
                        size_t size,
                        const ReadBinaryOptions& options,
                        Errors* errors,
                        ModuleDesc* out_module) {
  BinaryReaderInterp reader(out_module, errors, options.features);
  return ReadBinary(data, size, &reader, options);
}